

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsTextItemPrivate::_q_update(QGraphicsTextItemPrivate *this,QRectF rect)

{
  int iVar1;
  char cVar2;
  qreal qVar3;
  
  if ((rect.w <= 0.0) || (rect.h <= 0.0)) {
    rect.xp = (this->boundingRect).xp;
    rect.yp = (this->boundingRect).yp;
    rect.w = (this->boundingRect).w;
    rect.h = (this->boundingRect).h;
  }
  else {
    iVar1 = this->pageNumber;
    qVar3 = rect.h;
    QWidgetTextControl::document((QWidgetTextControl *)this->control);
    QTextDocument::pageSize();
    rect.yp = rect.yp - qVar3 * (double)iVar1;
  }
  cVar2 = QRectF::intersects(&rect);
  if (cVar2 != '\0') {
    QGraphicsItem::update(&(this->qq->super_QGraphicsObject).super_QGraphicsItem,&rect);
  }
  return;
}

Assistant:

void QGraphicsTextItemPrivate::_q_update(QRectF rect)
{
    if (rect.isValid()) {
        rect.translate(-controlOffset());
    } else {
        rect = boundingRect;
    }
    if (rect.intersects(boundingRect))
        qq->update(rect);
}